

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

size_t my_strcat(char *buf,char *src,size_t bufsize)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strlen(buf);
  if (sVar1 + 1 < bufsize) {
    sVar2 = my_strcpy(buf + sVar1,src,bufsize - sVar1);
  }
  else {
    sVar2 = strlen(src);
  }
  return sVar2 + sVar1;
}

Assistant:

size_t my_strcat(char *buf, const char *src, size_t bufsize)
{
	size_t dlen = strlen(buf);

	/* Is there room left in the buffer? */
	if (dlen + 1 < bufsize) {
		/* Append as much as possible  */
		return (dlen + my_strcpy(buf + dlen, src, bufsize - dlen));
	} else {
		/* Return without appending */
		return (dlen + strlen(src));
	}
}